

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<int,int>>>>
::operator()(void *this,char *value_text,
            flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *x)

{
  bool bVar1;
  UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
  *this_00;
  AssertionResult *other;
  __normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>_>
  in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  Matcher<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
  matcher;
  StringMatchResultListener listener;
  stringstream ss;
  undefined1 local_390 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  MatcherBase<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
  local_360;
  undefined1 local_348 [16];
  pointer local_338;
  ostream local_328 [112];
  ios_base local_2b8 [264];
  IterateOverTuple<std::tuple<testing::internal::PairMatcher<int,_int>_>,_1UL> local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  local_348._0_8_ = (pointer)0x0;
  local_348._8_8_ = (ostream *)0x0;
  local_338 = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>
  ::reserve((vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>
             *)local_348,1);
  TransformTupleValuesHelper<std::tuple<testing::internal::PairMatcher<int,_int>_>,_testing::internal::CastAndAppendTransform<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>_>_>
  ::IterateOverTuple<std::tuple<testing::internal::PairMatcher<int,_int>_>,_1UL>::operator()
            (local_1b0,value_text,local_348);
  this_00 = (UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<unsigned_long_const,unsigned_long>const&>*,std::vector<testing::Matcher<std::pair<unsigned_long_const,unsigned_long>const&>,std::allocator<testing::Matcher<std::pair<unsigned_long_const,unsigned_long>const&>>>>>
            (this_00,(Flags)local_348._0_8_,
             (__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>_>
              )local_348._8_8_,in_RCX);
  local_360.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00328c50;
  local_360.buffer_.ptr = (void *)0x0;
  local_360.vtable_ =
       (VTable *)
       MatcherBase<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
       ::
       GetVTable<testing::internal::MatcherBase<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>::ValuePolicy<testing::MatcherInterface<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>const*,true>>()
       ::kVTable;
  local_360.buffer_.ptr = operator_new(0x10);
  ((local_360.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
    **)(local_360.buffer_.i + 8) = this_00;
  local_360.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00328be0;
  std::
  vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>
  ::~vector((vector<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_long,_unsigned_long>_&>_>_>
             *)local_348);
  local_348._8_8_ = (ostream *)0x0;
  local_348._0_8_ = &PTR__MatchResultListener_00328ef0;
  bVar1 = MatcherBase<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
          ::MatchAndExplain(&local_360,x,(MatchResultListener *)local_348);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Value of: ",10);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"m",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Expected: ",10);
    MatcherBase<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
    ::DescribeTo(&local_360,local_1a0);
    local_348._8_8_ = local_328;
    local_348._0_8_ = &PTR__StringMatchResultListener_00328f58;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_338);
    bVar1 = MatchPrintAndExplain<phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const,phmap::flat_hash_map<unsigned_long,unsigned_long,phmap::priv::(anonymous_namespace)::Hash,phmap::priv::(anonymous_namespace)::Eq,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>const&>
                      (x,(Matcher<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
                          *)&local_360,(MatchResultListener *)local_348);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_380._M_dataplus._M_p,local_380._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<((AssertionResult *)local_390,&local_380);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_388._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_388,local_388._M_head_impl);
    }
    local_348._0_8_ = &PTR__StringMatchResultListener_00328f58;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_338);
    std::ios_base::~ios_base(local_2b8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  MatcherBase<const_phmap::flat_hash_map<unsigned_long,_unsigned_long,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_&>
  ::~MatcherBase(&local_360);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }